

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::InitializeProgressMarks(cmGlobalUnixMakefileGenerator3 *this)

{
  cmLocalGenerator *this_00;
  cmLocalGenerator *this_01;
  bool bVar1;
  TargetType TVar2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_02;
  reference ppcVar3;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_03;
  reference ppcVar4;
  mapped_type *this_04;
  set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_> *this_05;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar5;
  byte local_14b;
  bool local_131;
  cmStateSnapshot local_128;
  _Base_ptr local_110;
  undefined1 local_108;
  cmGeneratorTarget *local_100;
  reference local_f8;
  cmTargetDepend *tgtdep;
  iterator __end4;
  iterator __begin4;
  TargetDependSet *__range4;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *targetSet;
  cmStateSnapshot tsnp;
  cmStateSnapshot csnp;
  allocator<char> local_79;
  string local_78;
  cmLocalGenerator *local_58;
  cmLocalGenerator *tlg;
  cmGeneratorTarget *gt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range2;
  cmLocalGenerator *lg;
  iterator __end1;
  iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  std::
  map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  ::clear(&this->DirectoryTargetsMap);
  this_02 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(this_02);
  lg = (cmLocalGenerator *)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(this_02);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                     *)&lg), bVar1) {
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppcVar3;
    this_03 = cmLocalGenerator::GetGeneratorTargets(this_00);
    __end2 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(this_03);
    gt = (cmGeneratorTarget *)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_03);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                       *)&gt), bVar1) {
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&__end2);
      tlg = (cmLocalGenerator *)*ppcVar4;
      local_58 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)tlg);
      TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)tlg);
      this_01 = tlg;
      local_131 = true;
      if (TVar2 != INTERFACE_LIBRARY) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"EXCLUDE_FROM_ALL",&local_79);
        local_131 = cmGeneratorTarget::GetPropertyAsBool((cmGeneratorTarget *)this_01,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator(&local_79);
      }
      if (local_131 == false) {
        cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&tsnp.Position.Position,this_00);
        cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&targetSet,local_58);
        while( true ) {
          bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)&tsnp.Position.Position);
          local_14b = 0;
          if (bVar1) {
            bVar1 = cmGlobalGenerator::IsExcluded
                              ((cmGlobalGenerator *)this,(cmStateSnapshot *)&tsnp.Position.Position,
                               (cmStateSnapshot *)&targetSet);
            local_14b = bVar1 ^ 0xff;
          }
          if ((local_14b & 1) == 0) break;
          this_04 = std::
                    map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                    ::operator[](&this->DirectoryTargetsMap,(key_type *)&tsnp.Position.Position);
          std::
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::insert(this_04,(value_type *)&tlg);
          this_05 = &cmGlobalGenerator::GetTargetDirectDepends
                               ((cmGlobalGenerator *)this,(cmGeneratorTarget *)tlg)->
                     super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
          ;
          __end4 = std::
                   set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
                   begin(this_05);
          tgtdep = (cmTargetDepend *)
                   std::
                   set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
                   end(this_05);
          while (bVar1 = std::operator!=(&__end4,(_Self *)&tgtdep), bVar1) {
            local_f8 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&__end4);
            local_100 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(local_f8);
            pVar5 = std::
                    set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::insert(this_04,&local_100);
            local_110 = (_Base_ptr)pVar5.first._M_node;
            local_108 = pVar5.second;
            std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&__end4);
          }
          cmStateSnapshot::GetBuildsystemDirectoryParent
                    (&local_128,(cmStateSnapshot *)&tsnp.Position.Position);
        }
      }
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::InitializeProgressMarks()
{
  this->DirectoryTargetsMap.clear();
  // Loop over all targets in all local generators.
  for (cmLocalGenerator* lg : this->LocalGenerators) {
    for (cmGeneratorTarget* gt : lg->GetGeneratorTargets()) {
      cmLocalGenerator* tlg = gt->GetLocalGenerator();

      if (gt->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
          gt->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
        continue;
      }

      cmStateSnapshot csnp = lg->GetStateSnapshot();
      cmStateSnapshot tsnp = tlg->GetStateSnapshot();

      // Consider the directory containing the target and all its
      // parents until something excludes the target.
      for (; csnp.IsValid() && !this->IsExcluded(csnp, tsnp);
           csnp = csnp.GetBuildsystemDirectoryParent()) {
        // This local generator includes the target.
        std::set<cmGeneratorTarget const*>& targetSet =
          this->DirectoryTargetsMap[csnp];
        targetSet.insert(gt);

        // Add dependencies of the included target.  An excluded
        // target may still be included if it is a dependency of a
        // non-excluded target.
        for (cmTargetDepend const& tgtdep : this->GetTargetDirectDepends(gt)) {
          targetSet.insert(tgtdep);
        }
      }
    }
  }
}